

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O0

void __thiscall DataServer::operator()(DataServer *this)

{
  __mode_t __mode;
  unique_lock<std::mutex> *this_00;
  reference rVar1;
  reference local_48 [2];
  DataServer *local_28;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lk;
  DataServer *this_local;
  
  lk._8_8_ = this;
  do {
    this_00 = (unique_lock<std::mutex> *)local_20;
    std::unique_lock<std::mutex>::unique_lock(this_00,&nd_m);
    local_28 = this;
    std::condition_variable::operator()
              ((condition_variable *)nd_cv,this_00,(anon_class_8_1_8991fb9c)this);
    if (((ispropercmd & 1U) == 0) || ((type != put && (type != put2)))) {
      if (((ispropercmd & 1U) == 0) || ((type != read && (type != read2)))) {
        if (((ispropercmd & 1U) != 0) && (type == mkdir)) {
          mkdir(this,(char *)this_00,__mode);
        }
      }
      else if (((is_ready_read & 1U) != 0) && (server_executing_read == this->serverId)) {
        readFileAndOutput(this);
      }
    }
    else {
      saveFile(this);
    }
    rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&dataNotified,(long)this->serverId)
    ;
    local_48[0] = rVar1;
    std::_Bit_reference::operator=(local_48,false);
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  } while( true );
}

Assistant:

void operator() () const
    {
        for (;;)
        {
            unique_lock<mutex> lk(nd_m);
            nd_cv.wait(lk, [this]{return dataNotified[serverId];});

            if (ispropercmd && (type == MsgType::put || type == MsgType::put2))
            {
                saveFile();
            }
            else if (ispropercmd && (type == MsgType::read || type == MsgType::read2)){

                if (is_ready_read && server_executing_read == serverId)
                {
                    //cout << "is ready read and my id is " << serverId << endl;
                    readFileAndOutput();
                }
            }
            else if (ispropercmd && type == MsgType::mkdir)
            {
                mkdir();
            }
            //cout << serverId << " data notified \n";
            dataNotified[serverId] = false;
            lk.unlock();
            nd_cv.notify_all();
        }

    }